

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

rb_node * rb_next(rb_node *rbn)

{
  bool bVar1;
  rb_node *local_10;
  rb_node *rbn_local;
  
  if (rbn->right == (rb_node *)0x0) {
    local_10 = rbn;
    if ((rbn->parent == (rb_node *)0x0) || (rbn != rbn->parent->left)) {
      while( true ) {
        bVar1 = false;
        if (local_10->parent != (rb_node *)0x0) {
          bVar1 = local_10 == local_10->parent->right;
        }
        if (!bVar1) break;
        local_10 = local_10->parent;
      }
      local_10 = local_10->parent;
    }
    else {
      local_10 = rbn->parent;
    }
  }
  else {
    for (local_10 = rbn->right; local_10->left != (rb_node *)0x0; local_10 = local_10->left) {
    }
  }
  return local_10;
}

Assistant:

static struct rb_node *
rb_next(struct rb_node *rbn)
{
    if (RBN_RIGHT(rbn) != NULL) {
        rbn = RBN_RIGHT(rbn);
        while (RBN_LEFT(rbn) != NULL) {
            rbn = RBN_LEFT(rbn);
        }
    } else {
        if (RBN_PARENT(rbn) && (rbn == RBN_LEFT(RBN_PARENT(rbn)))) {
            rbn = RBN_PARENT(rbn);
        } else {
            while (RBN_PARENT(rbn) &&
                    (rbn == RBN_RIGHT(RBN_PARENT(rbn)))) {
                rbn = RBN_PARENT(rbn);
            }
            rbn = RBN_PARENT(rbn);
        }
    }

    return rbn;
}